

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

lua_CFunction lua_atpanic(lua_State *L,lua_CFunction panicf)

{
  lua_CFunction p_Var1;
  
  p_Var1 = L->l_G->panic;
  L->l_G->panic = panicf;
  return p_Var1;
}

Assistant:

LUA_API lua_CFunction lua_atpanic(lua_State *L, lua_CFunction panicf) {
    lua_CFunction old;
    lua_lock(L);
    old = G(L)->panic;
    G(L)->panic = panicf;
    lua_unlock(L);
    return old;
}